

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

void __thiscall iDynTree::InverseKinematics::~InverseKinematics(InverseKinematics *this)

{
  missingIpoptErrorReport();
  return;
}

Assistant:

InverseKinematics::~InverseKinematics()
    {
#ifdef IDYNTREE_USES_IPOPT
        if (m_pimpl) {
            delete IK_PIMPL(m_pimpl);
            m_pimpl = 0;
        }
#else
        missingIpoptErrorReport();
#endif
    }